

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

CURLcode Curl_base64_decode(char *src,uchar **outptr,size_t *outlen)

{
  uchar uVar1;
  size_t sVar2;
  char *pcVar3;
  uchar *puVar4;
  void *pvVar5;
  unsigned_long uVar6;
  ulong uVar7;
  long lVar8;
  uchar *puVar9;
  ulong uVar10;
  CURLcode CVar11;
  size_t padding;
  size_t sVar12;
  long lVar13;
  
  *outptr = (uchar *)0x0;
  *outlen = 0;
  sVar2 = strlen(src);
  if ((sVar2 & 3) == 0 && sVar2 != 0) {
    pcVar3 = strchr(src,0x3d);
    lVar8 = 0;
    if (pcVar3 != (char *)0x0) {
      if (pcVar3 + (ulong)(pcVar3[1] == '=') + 1 != src + sVar2) {
        return CURLE_BAD_CONTENT_ENCODING;
      }
      lVar8 = (ulong)(pcVar3[1] == '=') + 1;
    }
    sVar12 = (sVar2 >> 2) * 3 - lVar8;
    puVar4 = (uchar *)(*Curl_cmalloc)(sVar12 + 1);
    if (puVar4 == (uchar *)0x0) {
      CVar11 = CURLE_OUT_OF_MEMORY;
    }
    else {
      puVar9 = puVar4;
      for (uVar7 = 0; uVar7 != sVar2 >> 2; uVar7 = uVar7 + 1) {
        lVar8 = 0;
        uVar10 = 0;
        for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
          if (src[lVar13] == 0x3d) {
            uVar10 = uVar10 << 6;
            lVar8 = lVar8 + 1;
          }
          else {
            pvVar5 = memchr("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/=",
                            (int)src[lVar13],0x42);
            if (pvVar5 == (void *)0x0) goto LAB_00453029;
            uVar6 = curlx_uztoul((long)pvVar5 - 0x605a70);
            uVar10 = uVar10 * 0x40 + uVar6;
          }
        }
        if (lVar8 == 1) {
LAB_00452fe7:
          uVar1 = curlx_ultouc(uVar10 >> 8 & 0xff);
          puVar9[1] = uVar1;
        }
        else if (lVar8 == 0) {
          uVar1 = curlx_ultouc(uVar10 & 0xff);
          puVar9[2] = uVar1;
          goto LAB_00452fe7;
        }
        uVar1 = curlx_ultouc(uVar10 >> 0x10 & 0xff);
        *puVar9 = uVar1;
        if (lVar8 == 3) {
LAB_00453029:
          (*Curl_cfree)(puVar4);
          goto LAB_00453037;
        }
        puVar9 = puVar9 + (3 - lVar8);
        src = src + 4;
      }
      *puVar9 = '\0';
      *outptr = puVar4;
      *outlen = sVar12;
      CVar11 = CURLE_OK;
    }
  }
  else {
LAB_00453037:
    CVar11 = CURLE_BAD_CONTENT_ENCODING;
  }
  return CVar11;
}

Assistant:

CURLcode Curl_base64_decode(const char *src,
                            unsigned char **outptr, size_t *outlen)
{
  size_t srclen = 0;
  size_t padding = 0;
  size_t i;
  size_t numQuantums;
  size_t rawlen = 0;
  const char *padptr;
  unsigned char *pos;
  unsigned char *newstr;

  *outptr = NULL;
  *outlen = 0;
  srclen = strlen(src);

  /* Check the length of the input string is valid */
  if(!srclen || srclen % 4)
    return CURLE_BAD_CONTENT_ENCODING;

  /* Find the position of any = padding characters */
  padptr = strchr(src, '=');
  if(padptr) {
    padding++;
    /* A maximum of two = padding characters is allowed */
    if(padptr[1] == '=')
      padding++;

    /* Check the = padding characters weren't part way through the input */
    if(padptr + padding != src + srclen)
      return CURLE_BAD_CONTENT_ENCODING;
  }

  /* Calculate the number of quantums */
  numQuantums = srclen / 4;

  /* Calculate the size of the decoded string */
  rawlen = (numQuantums * 3) - padding;

  /* Allocate our buffer including room for a null-terminator */
  newstr = malloc(rawlen + 1);
  if(!newstr)
    return CURLE_OUT_OF_MEMORY;

  pos = newstr;

  /* Decode the quantums */
  for(i = 0; i < numQuantums; i++) {
    size_t result = decodeQuantum(pos, src);
    if(!result) {
      free(newstr);

      return CURLE_BAD_CONTENT_ENCODING;
    }

    pos += result;
    src += 4;
  }

  /* Zero terminate */
  *pos = '\0';

  /* Return the decoded data */
  *outptr = newstr;
  *outlen = rawlen;

  return CURLE_OK;
}